

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O0

Vec_Int_t * vectorDifference(Vec_Int_t *A,Vec_Int_t *B)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  undefined4 local_28;
  int i;
  int iElem;
  Vec_Int_t *C;
  Vec_Int_t *B_local;
  Vec_Int_t *A_local;
  
  p = Vec_IntAlloc(0);
  for (local_28 = 0; iVar1 = Vec_IntSize(A), local_28 < iVar1; local_28 = local_28 + 1) {
    iVar1 = Vec_IntEntry(A,local_28);
    iVar2 = Vec_IntFind(B,iVar1);
    if (iVar2 == -1) {
      Vec_IntPush(p,iVar1);
    }
  }
  return p;
}

Assistant:

Vec_Int_t *vectorDifference(Vec_Int_t *A, Vec_Int_t *B)
{
	Vec_Int_t *C;
	int iElem, i;

	C = Vec_IntAlloc(0);
	Vec_IntForEachEntry( A, iElem, i )
	{
		if( Vec_IntFind( B, iElem ) == -1 )
		{
			Vec_IntPush( C, iElem );
		}
	}

	return C;
}